

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void mkportal(level *lev,xchar x,xchar y,xchar todnum,xchar todlevel)

{
  trap *ptVar1;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  
  ptVar1 = maketrap(lev,CONCAT31(in_register_00000031,x),CONCAT31(in_register_00000011,y),0x12);
  if (ptVar1 != (trap *)0x0) {
    (ptVar1->dst).dnum = todnum;
    (ptVar1->dst).dlevel = todlevel;
    return;
  }
  impossible("portal on top of portal??");
  return;
}

Assistant:

void mkportal(struct level *lev, xchar x, xchar y, xchar todnum, xchar todlevel)
{
	/* a portal "trap" must be matched by a */
	/* portal in the destination dungeon/dlevel */
	struct trap *ttmp = maketrap(lev, x, y, MAGIC_PORTAL);

	if (!ttmp) {
		impossible("portal on top of portal??");
		return;
	}
	ttmp->dst.dnum = todnum;
	ttmp->dst.dlevel = todlevel;
	return;
}